

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_t fs_which(char *name,char *path,bool find_all,char *result,size_t buffer_size)

{
  size_type sVar1;
  string_view local_80;
  string_view local_70;
  string local_60;
  __sv_type local_40;
  size_t local_30;
  size_t buffer_size_local;
  char *result_local;
  char *pcStack_18;
  bool find_all_local;
  char *path_local;
  char *name_local;
  
  local_30 = buffer_size;
  buffer_size_local = (size_t)result;
  result_local._7_1_ = find_all;
  pcStack_18 = path;
  path_local = name;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,name);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,pcStack_18);
  fs_which_abi_cxx11_(&local_60,local_70,local_80,(bool)(result_local._7_1_ & 1));
  local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  sVar1 = fs_str2char(local_40,(char *)buffer_size_local,local_30);
  std::__cxx11::string::~string((string *)&local_60);
  return sVar1;
}

Assistant:

size_t fs_which(const char* name, const char* path, const bool find_all, char* result, const size_t buffer_size){
  return fs_str2char(fs_which(name, path, find_all), result, buffer_size);
}